

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

UnblindParameter * __thiscall
cfd::core::ConfidentialTransaction::UnblindTxOut
          (UnblindParameter *__return_storage_ptr__,ConfidentialTransaction *this,
          uint32_t tx_out_index,Privkey *blinding_key)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint index;
  pointer puVar4;
  size_t sVar5;
  CfdException *this_00;
  ulong uVar6;
  size_t sVar7;
  bool bVar8;
  ConfidentialTxOut tx_out;
  uint local_28c;
  ByteData local_288;
  Script local_270;
  ByteData local_238;
  ByteData local_218;
  Privkey *local_1f8;
  ConfidentialNonce local_1f0;
  ConfidentialValue local_1c8;
  ConfidentialValue local_1a0;
  ConfidentialNonce local_178;
  ConfidentialAssetId local_150;
  ConfidentialTxOut local_128;
  
  local_28c = tx_out_index;
  local_1f8 = blinding_key;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xc])
            (this,(ulong)tx_out_index,0xb46,"UnblindTxOut");
  ConfidentialTxOut::ConfidentialTxOut
            (&local_128,
             (this->vout_).
             super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
             ._M_impl.super__Vector_impl_data._M_start + local_28c);
  ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)&local_270,&local_128.asset_);
  bVar8 = true;
  if (1 < (byte)local_270.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    ConfidentialNonce::ConfidentialNonce(&local_178,&local_128.nonce_);
    if (1 < local_178.version_) {
      ConfidentialValue::ConfidentialValue(&local_1a0,&local_128.confidential_value_);
      if (local_1a0.version_ < 2) {
        bVar2 = false;
      }
      else {
        local_218.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_218.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_218.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar6 = (long)local_128.range_proof_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_128.range_proof_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        if (uVar6 == 0) {
          puVar4 = (pointer)0x0;
        }
        else {
          if ((long)uVar6 < 0) {
            ::std::__throw_bad_alloc();
          }
          puVar4 = (pointer)operator_new(uVar6);
        }
        local_218.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = puVar4 + uVar6;
        sVar7 = (long)local_128.range_proof_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_128.range_proof_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        local_218.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = puVar4;
        if (sVar7 != 0) {
          local_218.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar4;
          memmove(puVar4,local_128.range_proof_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,sVar7);
        }
        local_218.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar4 + sVar7;
        sVar5 = ByteData::GetDataSize(&local_218);
        if (sVar5 != 0) {
          local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          uVar6 = (long)local_128.surjection_proof_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_128.surjection_proof_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
          if (uVar6 == 0) {
            puVar4 = (pointer)0x0;
          }
          else {
            if ((long)uVar6 < 0) {
              ::std::__throw_bad_alloc();
            }
            puVar4 = (pointer)operator_new(uVar6);
          }
          local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = puVar4 + uVar6;
          sVar7 = (long)local_128.surjection_proof_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_128.surjection_proof_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
          local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = puVar4;
          if (sVar7 != 0) {
            local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar4;
            memmove(puVar4,local_128.surjection_proof_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,sVar7);
          }
          local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar4 + sVar7;
          sVar5 = ByteData::GetDataSize(&local_238);
          bVar8 = sVar5 == 0;
          bVar3 = true;
          bVar2 = true;
          bVar1 = true;
          goto LAB_001f5e4d;
        }
        bVar2 = true;
      }
      bVar1 = false;
      bVar3 = true;
      bVar8 = true;
      goto LAB_001f5e4d;
    }
  }
  bVar3 = false;
  bVar2 = false;
  bVar1 = false;
LAB_001f5e4d:
  if ((bVar1) &&
     (local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_238.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((bVar2) &&
     (local_218.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_218.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (bVar3) {
    local_1a0._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0025b008;
    if (local_1a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (1 < (byte)local_270.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    local_178._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_0025afc8;
    if (local_178.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_178.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  local_270._vptr_Script = (_func_int **)&PTR__ConfidentialAssetId_0025afe8;
  if ((void *)CONCAT44(local_270.script_data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_270.script_data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_270.script_data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_270.script_data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  if (!bVar8) {
    ConfidentialNonce::ConfidentialNonce(&local_1f0,&local_128.nonce_);
    local_288.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar6 = (long)local_128.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_128.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar6 == 0) {
      puVar4 = (pointer)0x0;
    }
    else {
      if ((long)uVar6 < 0) {
        ::std::__throw_bad_alloc();
      }
      puVar4 = (pointer)operator_new(uVar6);
    }
    local_288.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar4 + uVar6;
    sVar7 = (long)local_128.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_128.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_288.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar4;
    if (sVar7 != 0) {
      local_288.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar4;
      memmove(puVar4,local_128.range_proof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar7);
    }
    local_288.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4 + sVar7;
    ConfidentialValue::ConfidentialValue(&local_1c8,&local_128.confidential_value_);
    AbstractTxOut::GetLockingScript(&local_270,&local_128.super_AbstractTxOut);
    ConfidentialAssetId::ConfidentialAssetId(&local_150,&local_128.asset_);
    CalculateUnblindData
              (__return_storage_ptr__,&local_1f0,local_1f8,&local_288,&local_1c8,&local_270,
               &local_150);
    local_150._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0025afe8;
    if (local_150.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_150.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    Script::~Script(&local_270);
    local_1c8._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0025b008;
    if (local_1c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_288.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_288.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_1f0._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_0025afc8;
    if (local_1f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    index = local_28c;
    ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&local_270);
    ByteData::ByteData((ByteData *)&local_1f0);
    ByteData::ByteData((ByteData *)&local_1c8);
    SetTxOutCommitment(this,index,&__return_storage_ptr__->asset,&__return_storage_ptr__->value,
                       (ConfidentialNonce *)&local_270,(ByteData *)&local_1f0,(ByteData *)&local_1c8
                      );
    if (local_1c8._vptr_ConfidentialValue != (_func_int **)0x0) {
      operator_delete(local_1c8._vptr_ConfidentialValue);
    }
    if (local_1f0._vptr_ConfidentialNonce != (_func_int **)0x0) {
      operator_delete(local_1f0._vptr_ConfidentialNonce);
    }
    local_270._vptr_Script = (_func_int **)&PTR__ConfidentialNonce_0025afc8;
    if ((void *)CONCAT44(local_270.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_270.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_270.script_data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_270.script_data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_));
    }
    ConfidentialTxOut::~ConfidentialTxOut(&local_128);
    return __return_storage_ptr__;
  }
  local_270._vptr_Script = (_func_int **)0x221227;
  local_270.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb4e;
  local_270.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "UnblindTxOut";
  logger::log<unsigned_int&>
            ((CfdSourceLocation *)&local_270,kCfdLogLevelWarning,
             "Failed to unblind TxOut. Target TxOut already unblinded.: tx_out_index=[{}]",
             &local_28c);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_270._vptr_Script =
       (_func_int **)
       &local_270.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_270,"Failed to unblind TxOut. Target TxOut already unblinded.","");
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)&local_270);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

UnblindParameter ConfidentialTransaction::UnblindTxOut(
    uint32_t tx_out_index, const Privkey &blinding_key) {
  CheckTxOutIndex(tx_out_index, __LINE__, __FUNCTION__);

  ConfidentialTxOut tx_out(vout_[tx_out_index]);
  if (!tx_out.GetAsset().HasBlinding() || !tx_out.GetNonce().HasBlinding() ||
      !tx_out.GetConfidentialValue().HasBlinding() ||
      (tx_out.GetRangeProof().GetDataSize() == 0) ||
      (tx_out.GetSurjectionProof().GetDataSize() == 0)) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to unblind TxOut. Target TxOut already unblinded.: "
        "tx_out_index=[{}]",
        tx_out_index);
    throw CfdException(
        kCfdIllegalStateError,
        "Failed to unblind TxOut. Target TxOut already unblinded.");
  }

  UnblindParameter result = CalculateUnblindData(
      tx_out.GetNonce(), blinding_key, tx_out.GetRangeProof(),
      tx_out.GetConfidentialValue(), tx_out.GetLockingScript(),
      tx_out.GetAsset());

  // clear and set unblind value to txout
  SetTxOutCommitment(
      tx_out_index, result.asset, result.value, ConfidentialNonce(),
      ByteData(), ByteData());

  return result;
}